

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  pointer pMVar7;
  Mat *this_00;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  void *pvVar15;
  uint uVar16;
  void *pvVar17;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  void *pvVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  float *ptr1_7;
  void *pvVar27;
  float *ptr_7;
  float fVar28;
  float fVar29;
  ulong local_90;
  ulong local_88;
  ulong local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    uVar1 = pMVar7->w;
    uVar18 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar23 = (ulong)uVar4;
    uVar14 = uVar3 * uVar2;
    iVar25 = pMVar7->dims;
    if (iVar25 == 1) {
      if (uVar1 == 1) {
        iVar25 = pMVar7[1].dims;
        if (iVar25 == 1) {
          Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar23 = 0;
          do {
            *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) + fVar28
            ;
            uVar23 = uVar23 + 1;
          } while (uVar24 != uVar23);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar23 = 0;
          do {
            *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) + fVar28
            ;
            uVar23 = uVar23 + 1;
          } while (uVar14 != uVar23);
          return 0;
        }
        if (iVar25 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar17 + uVar18 * 4) + fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar24 != uVar23);
          return 0;
        }
      }
      iVar25 = pMVar7[1].dims;
      if (iVar25 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        iVar25 = -100;
        if ((pvVar15 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (pMVar7[1].w == 1) {
            iVar25 = 0;
            if (0 < (int)uVar1) {
              fVar28 = *pMVar7[1].data;
              pvVar17 = pMVar7->data;
              uVar23 = 0;
              do {
                *(float *)((long)pvVar15 + uVar23 * 4) =
                     *(float *)((long)pvVar17 + uVar23 * 4) + fVar28;
                uVar23 = uVar23 + 1;
              } while (uVar18 != uVar23);
              iVar25 = 0;
            }
          }
          else {
            iVar25 = 0;
            if (0 < (int)uVar1) {
              pvVar17 = pMVar7->data;
              pvVar21 = pMVar7[1].data;
              uVar23 = 0;
              do {
                *(float *)((long)pvVar15 + uVar23 * 4) =
                     *(float *)((long)pvVar21 + uVar23 * 4) + *(float *)((long)pvVar17 + uVar23 * 4)
                ;
                uVar23 = uVar23 + 1;
              } while (uVar18 != uVar23);
              iVar25 = 0;
            }
          }
        }
      }
      else if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        iVar25 = -100;
        if (((pvVar15 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) &&
           (iVar25 = 0, 0 < (int)uVar3)) {
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar22 = (long)(int)uVar2 * 4;
          uVar23 = 0;
          iVar25 = 0;
          do {
            if (0 < (int)uVar2) {
              fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) + fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar24 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar22);
            pvVar21 = (void *)((long)pvVar21 + lVar22);
          } while (uVar23 != uVar3);
        }
      }
      else if (iVar25 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        iVar25 = -100;
        if (((pvVar15 != (void *)0x0) && (sVar8 = this_00->cstep, (long)this_00->c * sVar8 != 0)) &&
           (iVar25 = 0, 0 < (int)uVar4)) {
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar24 = 0;
          iVar25 = 0;
          do {
            if (0 < (int)uVar14) {
              fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) + fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar24 != uVar23);
        }
      }
      else {
        iVar25 = 0;
      }
      return iVar25;
    }
    uVar5 = pMVar7->h;
    uVar16 = uVar5 * uVar1;
    if (iVar25 == 2) {
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        iVar25 = pMVar7->w;
        sVar9 = pMVar7->elemsize;
        sVar10 = pMVar7[1].elemsize;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar2 * 4;
        sVar12 = pMVar7[1].cstep;
        uVar18 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar26 = 0;
            pvVar19 = pvVar21;
            pvVar27 = pvVar15;
            do {
              if (0 < (int)uVar2) {
                fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar25 * sVar9 * uVar18);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar27 + uVar20 * 4) =
                       *(float *)((long)pvVar19 + uVar20 * 4) + fVar28;
                  uVar20 = uVar20 + 1;
                } while (uVar24 != uVar20);
              }
              uVar26 = uVar26 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar22);
              pvVar19 = (void *)((long)pvVar19 + lVar22);
            } while (uVar26 != uVar3);
          }
          uVar18 = uVar18 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
        } while (uVar18 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) =
               *(float *)((long)pvVar21 + uVar23 * 4) + *(float *)((long)pvVar17 + uVar23 * 4);
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar1 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            uVar24 = 0;
            do {
              *(float *)((long)pvVar15 + uVar24 * 4) =
                   *(float *)((long)pvVar17 + uVar24 * 4) + fVar28;
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar17 = (void *)((long)pvVar17 + lVar22);
        } while (uVar23 != uVar5);
        return 0;
      }
      if ((int)uVar16 < 1) {
        return 0;
      }
      fVar28 = *pMVar7[1].data;
      pvVar17 = pMVar7->data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) + fVar28;
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar6 = pMVar7->c;
    uVar24 = (ulong)uVar6;
    if (pMVar7[1].dims == 3) {
      if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
        Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = pMVar7[1].elemsize;
        sVar11 = pMVar7[1].cstep;
        sVar12 = this_00->elemsize;
        sVar13 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + sVar10 * sVar11 * uVar23) +
                   *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
        Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) + *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        sVar10 = pMVar7->cstep;
        pvVar21 = pMVar7[1].data;
        sVar11 = pMVar7[1].elemsize;
        sVar12 = this_00->elemsize;
        sVar13 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) +
                   *(float *)((long)pvVar17 + sVar9 * sVar10 * uVar24);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
        } while (uVar24 != uVar23);
        return 0;
      }
      if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
        Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = pMVar7[1].elemsize;
        sVar11 = this_00->elemsize;
        sVar12 = pMVar7[1].cstep;
        sVar13 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) + *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
        } while (uVar23 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      sVar9 = pMVar7[1].elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7[1].cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) =
                 *(float *)((long)pvVar21 + uVar18 * 4) + *(float *)((long)pvVar17 + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        uVar24 = uVar24 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
      } while (uVar24 != uVar23);
      return 0;
    }
    Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    sVar8 = this_00->cstep;
    if ((long)this_00->c * sVar8 == 0) {
      return -100;
    }
    if (pMVar7[1].dims != 1) {
      if (pMVar7[1].dims != 2) {
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      iVar25 = pMVar7[1].w;
      sVar10 = pMVar7[1].elemsize;
      pvVar21 = pMVar7[1].data;
      sVar11 = this_00->elemsize;
      lVar22 = (long)(int)uVar1 * 4;
      sVar12 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar26 = 0;
          pvVar19 = pvVar17;
          pvVar27 = pvVar15;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar23);
              uVar20 = 0;
              do {
                *(float *)((long)pvVar27 + uVar20 * 4) =
                     *(float *)((long)pvVar19 + uVar20 * 4) + fVar28;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
            }
            uVar26 = uVar26 + 1;
            pvVar27 = (void *)((long)pvVar27 + lVar22);
            pvVar19 = (void *)((long)pvVar19 + lVar22);
          } while (uVar26 != uVar5);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar6 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      pvVar21 = pMVar7[1].data;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = *(float *)((long)pvVar17 + uVar18 * 4) + fVar28
            ;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if ((int)uVar6 < 1) {
      return 0;
    }
    fVar28 = *pMVar7[1].data;
    pvVar17 = pMVar7->data;
    sVar9 = pMVar7->elemsize;
    sVar10 = this_00->elemsize;
    sVar11 = pMVar7->cstep;
    uVar23 = 0;
    do {
      if (0 < (int)uVar16) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar15 + uVar18 * 4) = *(float *)((long)pvVar17 + uVar18 * 4) + fVar28;
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
      }
      uVar23 = uVar23 + 1;
      pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
    } while (uVar23 != uVar24);
    return 0;
  case 2:
    uVar1 = pMVar7->w;
    uVar18 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar23 = (ulong)uVar4;
    uVar14 = uVar3 * uVar2;
    iVar25 = pMVar7->dims;
    if (iVar25 != 1) {
      uVar5 = pMVar7->h;
      uVar16 = uVar5 * uVar1;
      if (iVar25 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          iVar25 = pMVar7->w;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          lVar22 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar26 = 0;
              pvVar19 = pvVar21;
              pvVar27 = pvVar15;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar25 * sVar9 * uVar18);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar27 + uVar20 * 4) =
                         *(float *)((long)pvVar19 + uVar20 * 4) * fVar28;
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                uVar26 = uVar26 + 1;
                pvVar27 = (void *)((long)pvVar27 + lVar22);
                pvVar19 = (void *)((long)pvVar19 + lVar22);
              } while (uVar26 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
          } while (uVar18 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims != 1) {
          if (pMVar7[1].dims != 2) {
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar23 = 0;
          do {
            *(float *)((long)pvVar15 + uVar23 * 4) =
                 *(float *)((long)pvVar21 + uVar23 * 4) * *(float *)((long)pvVar17 + uVar23 * 4);
            uVar23 = uVar23 + 1;
          } while (uVar16 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar22 = (long)(int)uVar1 * 4;
          uVar23 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     *(float *)((long)pvVar17 + uVar24 * 4) * fVar28;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar22);
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar23 != uVar5);
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) * fVar28;
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar24 = (ulong)uVar6;
      if (pMVar7[1].dims == 3) {
        if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = pMVar7[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + sVar10 * sVar11 * uVar23) *
                     *(float *)((long)pvVar17 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) * *(float *)((long)pvVar17 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7->cstep;
          pvVar21 = pMVar7[1].data;
          sVar11 = pMVar7[1].elemsize;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) *
                     *(float *)((long)pvVar17 + sVar9 * sVar10 * uVar24);
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
          } while (uVar24 != uVar23);
          return 0;
        }
        if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar7[1].cstep;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) * *(float *)((long)pvVar17 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) * *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        iVar25 = pMVar7[1].w;
        sVar10 = pMVar7[1].elemsize;
        pvVar21 = pMVar7[1].data;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar1 * 4;
        sVar12 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar26 = 0;
            pvVar19 = pvVar17;
            pvVar27 = pvVar15;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar23);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar27 + uVar20 * 4) =
                       *(float *)((long)pvVar19 + uVar20 * 4) * fVar28;
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              uVar26 = uVar26 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar22);
              pvVar19 = (void *)((long)pvVar19 + lVar22);
            } while (uVar26 != uVar5);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
        } while (uVar23 != uVar24);
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) * fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      fVar28 = *pMVar7[1].data;
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = *(float *)((long)pvVar17 + uVar18 * 4) * fVar28
            ;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (uVar1 == 1) {
      iVar25 = pMVar7[1].dims;
      if (iVar25 == 1) {
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) * fVar28;
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) * fVar28;
          uVar23 = uVar23 + 1;
        } while (uVar14 != uVar23);
        return 0;
      }
      if (iVar25 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) * fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
    }
    iVar25 = pMVar7[1].dims;
    if (iVar25 != 1) {
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar2 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar2) {
            fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) * fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar21 = (void *)((long)pvVar21 + lVar22);
        } while (uVar23 != uVar3);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      sVar9 = pMVar7[1].elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7[1].cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = *(float *)((long)pvVar21 + uVar18 * 4) * fVar28
            ;
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        uVar24 = uVar24 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
      } while (uVar24 != uVar23);
      return 0;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar15 + uVar23 * 4) =
             *(float *)((long)pvVar21 + uVar23 * 4) * *(float *)((long)pvVar17 + uVar23 * 4);
        uVar23 = uVar23 + 1;
      } while (uVar18 != uVar23);
      return 0;
    }
    if ((int)uVar1 < 1) {
      return 0;
    }
    fVar28 = *pMVar7[1].data;
    pvVar17 = pMVar7->data;
    uVar23 = 0;
    do {
      *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) * fVar28;
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
    return 0;
  case 3:
    uVar1 = pMVar7->w;
    uVar18 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar23 = (ulong)uVar4;
    uVar14 = uVar3 * uVar2;
    iVar25 = pMVar7->dims;
    if (iVar25 != 1) {
      uVar5 = pMVar7->h;
      uVar16 = uVar5 * uVar1;
      if (iVar25 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          iVar25 = pMVar7->w;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          lVar22 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar26 = 0;
              pvVar19 = pvVar21;
              pvVar27 = pvVar15;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar25 * sVar9 * uVar18);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar27 + uVar20 * 4) =
                         fVar28 / *(float *)((long)pvVar19 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                uVar26 = uVar26 + 1;
                pvVar27 = (void *)((long)pvVar27 + lVar22);
                pvVar19 = (void *)((long)pvVar19 + lVar22);
              } while (uVar26 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
          } while (uVar18 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims != 1) {
          if (pMVar7[1].dims != 2) {
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar23 = 0;
          do {
            *(float *)((long)pvVar15 + uVar23 * 4) =
                 *(float *)((long)pvVar17 + uVar23 * 4) / *(float *)((long)pvVar21 + uVar23 * 4);
            uVar23 = uVar23 + 1;
          } while (uVar16 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar22 = (long)(int)uVar1 * 4;
          uVar23 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     *(float *)((long)pvVar17 + uVar24 * 4) * (1.0 / fVar28);
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar22);
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar23 != uVar5);
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        fVar28 = *pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) =
               *(float *)((long)pvVar17 + uVar23 * 4) * (1.0 / fVar28);
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar24 = (ulong)uVar6;
      if (pMVar7[1].dims == 3) {
        if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = pMVar7[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar17 + uVar18 * 4) /
                     *(float *)((long)pvVar21 + sVar10 * sVar11 * uVar23);
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar17 + uVar18 * 4) / *(float *)((long)pvVar21 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7->cstep;
          pvVar21 = pMVar7[1].data;
          sVar11 = pMVar7[1].elemsize;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar17 + sVar9 * sVar10 * uVar24) /
                     *(float *)((long)pvVar21 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
          } while (uVar24 != uVar23);
          return 0;
        }
        if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar7[1].cstep;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar17 + uVar18 * 4) / *(float *)((long)pvVar21 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) / *(float *)((long)pvVar21 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        iVar25 = pMVar7[1].w;
        sVar10 = pMVar7[1].elemsize;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar1 * 4;
        sVar12 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar26 = 0;
            pvVar19 = pvVar17;
            pvVar27 = pvVar15;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar23);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar27 + uVar20 * 4) =
                       *(float *)((long)pvVar19 + uVar20 * 4) * (1.0 / fVar28);
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              uVar26 = uVar26 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar22);
              pvVar19 = (void *)((long)pvVar19 + lVar22);
            } while (uVar26 != uVar5);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
        } while (uVar23 != uVar24);
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) * (1.0 / fVar28);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar7->elemsize;
      fVar28 = *pMVar7[1].data;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) =
                 *(float *)((long)pvVar17 + uVar18 * 4) * (1.0 / fVar28);
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
        pvVar17 = (void *)((long)pvVar17 + sVar10 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (uVar1 == 1) {
      iVar25 = pMVar7[1].dims;
      if (iVar25 == 1) {
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar28 / *(float *)((long)pvVar17 + uVar23 * 4);
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar28 / *(float *)((long)pvVar17 + uVar23 * 4);
          uVar23 = uVar23 + 1;
        } while (uVar14 != uVar23);
        return 0;
      }
      if (iVar25 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   fVar28 / *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
    }
    iVar25 = pMVar7[1].dims;
    if (iVar25 != 1) {
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar2 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar2) {
            fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   fVar28 / *(float *)((long)pvVar21 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar21 = (void *)((long)pvVar21 + lVar22);
        } while (uVar23 != uVar3);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      sVar9 = pMVar7[1].elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7[1].cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = fVar28 / *(float *)((long)pvVar21 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        uVar24 = uVar24 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
      } while (uVar24 != uVar23);
      return 0;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar15 + uVar23 * 4) =
             *(float *)((long)pvVar17 + uVar23 * 4) / *(float *)((long)pvVar21 + uVar23 * 4);
        uVar23 = uVar23 + 1;
      } while (uVar18 != uVar23);
      return 0;
    }
    if ((int)uVar1 < 1) {
      return 0;
    }
    pvVar17 = pMVar7->data;
    fVar28 = *pMVar7[1].data;
    uVar23 = 0;
    do {
      *(float *)((long)pvVar15 + uVar23 * 4) =
           *(float *)((long)pvVar17 + uVar23 * 4) * (1.0 / fVar28);
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
    return 0;
  case 4:
    uVar1 = pMVar7->w;
    uVar18 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar23 = (ulong)uVar4;
    uVar14 = uVar3 * uVar2;
    iVar25 = pMVar7->dims;
    if (iVar25 != 1) {
      uVar5 = pMVar7->h;
      uVar16 = uVar5 * uVar1;
      if (iVar25 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          iVar25 = pMVar7->w;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          lVar22 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar26 = 0;
              pvVar19 = pvVar21;
              pvVar27 = pvVar15;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar25 * sVar9 * uVar18);
                  uVar20 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar19 + uVar20 * 4);
                    if (fVar29 <= fVar28) {
                      fVar29 = fVar28;
                    }
                    *(float *)((long)pvVar27 + uVar20 * 4) = fVar29;
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                uVar26 = uVar26 + 1;
                pvVar27 = (void *)((long)pvVar27 + lVar22);
                pvVar19 = (void *)((long)pvVar19 + lVar22);
              } while (uVar26 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
          } while (uVar18 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims != 1) {
          if (pMVar7[1].dims != 2) {
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar23 = 0;
          do {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
            if (fVar28 <= fVar29) {
              fVar28 = fVar29;
            }
            *(float *)((long)pvVar15 + uVar23 * 4) = fVar28;
            uVar23 = uVar23 + 1;
          } while (uVar16 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar22 = (long)(int)uVar1 * 4;
          uVar23 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
              uVar24 = 0;
              do {
                fVar29 = *(float *)((long)pvVar17 + uVar24 * 4);
                if (fVar29 <= fVar28) {
                  fVar29 = fVar28;
                }
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar29;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar22);
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar23 != uVar5);
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar23 = 0;
        do {
          fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
          if (fVar29 <= fVar28) {
            fVar29 = fVar28;
          }
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar24 = (ulong)uVar6;
      if (pMVar7[1].dims == 3) {
        if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = pMVar7[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                fVar28 = *(float *)((long)pvVar21 + sVar10 * sVar11 * uVar23);
                fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
                if (fVar28 <= fVar29) {
                  fVar28 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                fVar28 = *(float *)((long)pvVar21 + uVar18 * 4);
                fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
                if (fVar28 <= fVar29) {
                  fVar28 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7->cstep;
          pvVar21 = pMVar7[1].data;
          sVar11 = pMVar7[1].elemsize;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar18 = 0;
              do {
                fVar28 = *(float *)((long)pvVar21 + uVar18 * 4);
                fVar29 = *(float *)((long)pvVar17 + sVar9 * sVar10 * uVar24);
                if (fVar28 <= fVar29) {
                  fVar28 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
          } while (uVar24 != uVar23);
          return 0;
        }
        if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar7[1].cstep;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                fVar28 = *(float *)((long)pvVar21 + uVar18 * 4);
                fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
                if (fVar28 <= fVar29) {
                  fVar28 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              fVar28 = *(float *)((long)pvVar21 + uVar18 * 4);
              fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
              if (fVar28 <= fVar29) {
                fVar28 = fVar29;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        iVar25 = pMVar7[1].w;
        sVar10 = pMVar7[1].elemsize;
        pvVar21 = pMVar7[1].data;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar1 * 4;
        sVar12 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar26 = 0;
            pvVar19 = pvVar17;
            pvVar27 = pvVar15;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar23);
                uVar20 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar19 + uVar20 * 4);
                  if (fVar29 <= fVar28) {
                    fVar29 = fVar28;
                  }
                  *(float *)((long)pvVar27 + uVar20 * 4) = fVar29;
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              uVar26 = uVar26 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar22);
              pvVar19 = (void *)((long)pvVar19 + lVar22);
            } while (uVar26 != uVar5);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
        } while (uVar23 != uVar24);
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            uVar18 = 0;
            do {
              fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
              if (fVar29 <= fVar28) {
                fVar29 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      fVar28 = *pMVar7[1].data;
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
            if (fVar29 <= fVar28) {
              fVar29 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (uVar1 == 1) {
      iVar25 = pMVar7[1].dims;
      if (iVar25 == 1) {
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
          if (fVar29 <= fVar28) {
            fVar29 = fVar28;
          }
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
          if (fVar29 <= fVar28) {
            fVar29 = fVar28;
          }
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar14 != uVar23);
        return 0;
      }
      if (iVar25 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
              if (fVar29 <= fVar28) {
                fVar29 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
    }
    iVar25 = pMVar7[1].dims;
    if (iVar25 != 1) {
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar2 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar2) {
            fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
            uVar18 = 0;
            do {
              fVar29 = *(float *)((long)pvVar21 + uVar18 * 4);
              if (fVar29 <= fVar28) {
                fVar29 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar21 = (void *)((long)pvVar21 + lVar22);
        } while (uVar23 != uVar3);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
            uVar18 = 0;
            do {
              fVar29 = *(float *)((long)pvVar21 + uVar18 * 4);
              if (fVar29 <= fVar28) {
                fVar29 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      uVar23 = 0;
      do {
        fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
        fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
        if (fVar28 <= fVar29) {
          fVar28 = fVar29;
        }
        *(float *)((long)pvVar15 + uVar23 * 4) = fVar28;
        uVar23 = uVar23 + 1;
      } while (uVar18 != uVar23);
      return 0;
    }
    if ((int)uVar1 < 1) {
      return 0;
    }
    fVar28 = *pMVar7[1].data;
    pvVar17 = pMVar7->data;
    uVar23 = 0;
    do {
      fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
      if (fVar29 <= fVar28) {
        fVar29 = fVar28;
      }
      *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
    return 0;
  case 5:
    uVar1 = pMVar7->w;
    uVar18 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar23 = (ulong)uVar4;
    uVar14 = uVar3 * uVar2;
    iVar25 = pMVar7->dims;
    if (iVar25 != 1) {
      uVar5 = pMVar7->h;
      uVar16 = uVar5 * uVar1;
      if (iVar25 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          iVar25 = pMVar7->w;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          lVar22 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar26 = 0;
              pvVar19 = pvVar21;
              pvVar27 = pvVar15;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar25 * sVar9 * uVar18);
                  uVar20 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar19 + uVar20 * 4);
                    if (fVar28 <= fVar29) {
                      fVar29 = fVar28;
                    }
                    *(float *)((long)pvVar27 + uVar20 * 4) = fVar29;
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                uVar26 = uVar26 + 1;
                pvVar27 = (void *)((long)pvVar27 + lVar22);
                pvVar19 = (void *)((long)pvVar19 + lVar22);
              } while (uVar26 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
          } while (uVar18 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims != 1) {
          if (pMVar7[1].dims != 2) {
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar23 = 0;
          do {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
            if (fVar29 <= fVar28) {
              fVar28 = fVar29;
            }
            *(float *)((long)pvVar15 + uVar23 * 4) = fVar28;
            uVar23 = uVar23 + 1;
          } while (uVar16 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar22 = (long)(int)uVar1 * 4;
          uVar23 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
              uVar24 = 0;
              do {
                fVar29 = *(float *)((long)pvVar17 + uVar24 * 4);
                if (fVar28 <= fVar29) {
                  fVar29 = fVar28;
                }
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar29;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar22);
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar23 != uVar5);
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar23 = 0;
        do {
          fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
          if (fVar28 <= fVar29) {
            fVar29 = fVar28;
          }
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar24 = (ulong)uVar6;
      if (pMVar7[1].dims == 3) {
        if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = pMVar7[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                fVar28 = *(float *)((long)pvVar21 + sVar10 * sVar11 * uVar23);
                fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
                if (fVar29 <= fVar28) {
                  fVar28 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                fVar28 = *(float *)((long)pvVar21 + uVar18 * 4);
                fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
                if (fVar29 <= fVar28) {
                  fVar28 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7->cstep;
          pvVar21 = pMVar7[1].data;
          sVar11 = pMVar7[1].elemsize;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar18 = 0;
              do {
                fVar28 = *(float *)((long)pvVar21 + uVar18 * 4);
                fVar29 = *(float *)((long)pvVar17 + sVar9 * sVar10 * uVar24);
                if (fVar29 <= fVar28) {
                  fVar28 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
          } while (uVar24 != uVar23);
          return 0;
        }
        if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar7[1].cstep;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                fVar28 = *(float *)((long)pvVar21 + uVar18 * 4);
                fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
                if (fVar29 <= fVar28) {
                  fVar28 = fVar29;
                }
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              fVar28 = *(float *)((long)pvVar21 + uVar18 * 4);
              fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
              if (fVar29 <= fVar28) {
                fVar28 = fVar29;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        iVar25 = pMVar7[1].w;
        sVar10 = pMVar7[1].elemsize;
        pvVar21 = pMVar7[1].data;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar1 * 4;
        sVar12 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar26 = 0;
            pvVar19 = pvVar17;
            pvVar27 = pvVar15;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar23);
                uVar20 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar19 + uVar20 * 4);
                  if (fVar28 <= fVar29) {
                    fVar29 = fVar28;
                  }
                  *(float *)((long)pvVar27 + uVar20 * 4) = fVar29;
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              uVar26 = uVar26 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar22);
              pvVar19 = (void *)((long)pvVar19 + lVar22);
            } while (uVar26 != uVar5);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
        } while (uVar23 != uVar24);
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            uVar18 = 0;
            do {
              fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
              if (fVar28 <= fVar29) {
                fVar29 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      fVar28 = *pMVar7[1].data;
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
            if (fVar28 <= fVar29) {
              fVar29 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (uVar1 == 1) {
      iVar25 = pMVar7[1].dims;
      if (iVar25 == 1) {
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
          if (fVar28 <= fVar29) {
            fVar29 = fVar28;
          }
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
          if (fVar28 <= fVar29) {
            fVar29 = fVar28;
          }
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar14 != uVar23);
        return 0;
      }
      if (iVar25 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              fVar29 = *(float *)((long)pvVar17 + uVar18 * 4);
              if (fVar28 <= fVar29) {
                fVar29 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
    }
    iVar25 = pMVar7[1].dims;
    if (iVar25 != 1) {
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar2 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar2) {
            fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
            uVar18 = 0;
            do {
              fVar29 = *(float *)((long)pvVar21 + uVar18 * 4);
              if (fVar28 <= fVar29) {
                fVar29 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar21 = (void *)((long)pvVar21 + lVar22);
        } while (uVar23 != uVar3);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
            uVar18 = 0;
            do {
              fVar29 = *(float *)((long)pvVar21 + uVar18 * 4);
              if (fVar28 <= fVar29) {
                fVar29 = fVar28;
              }
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      uVar23 = 0;
      do {
        fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
        fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
        if (fVar29 <= fVar28) {
          fVar28 = fVar29;
        }
        *(float *)((long)pvVar15 + uVar23 * 4) = fVar28;
        uVar23 = uVar23 + 1;
      } while (uVar18 != uVar23);
      return 0;
    }
    if ((int)uVar1 < 1) {
      return 0;
    }
    fVar28 = *pMVar7[1].data;
    pvVar17 = pMVar7->data;
    uVar23 = 0;
    do {
      fVar29 = *(float *)((long)pvVar17 + uVar23 * 4);
      if (fVar28 <= fVar29) {
        fVar29 = fVar28;
      }
      *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
    return 0;
  case 6:
    uVar1 = pMVar7->w;
    uVar18 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar23 = (ulong)uVar4;
    uVar14 = uVar3 * uVar2;
    iVar25 = pMVar7->dims;
    if (iVar25 != 1) {
      uVar5 = pMVar7->h;
      uVar16 = uVar5 * uVar1;
      if (iVar25 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          local_58 = this_00->data;
          if (local_58 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = pMVar7->data;
          local_60 = pMVar7[1].data;
          iVar25 = pMVar7->w;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          lVar22 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          local_68 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar18 = 0;
              pvVar17 = local_58;
              pvVar21 = local_60;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar15 + uVar18 * 4 + (long)iVar25 * sVar9 * local_68);
                  uVar26 = 0;
                  do {
                    fVar29 = powf(fVar28,*(float *)((long)pvVar21 + uVar26 * 4));
                    *(float *)((long)pvVar17 + uVar26 * 4) = fVar29;
                    uVar26 = uVar26 + 1;
                  } while (uVar24 != uVar26);
                }
                uVar18 = uVar18 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar22);
                pvVar21 = (void *)((long)pvVar21 + lVar22);
              } while (uVar18 != uVar3);
            }
            local_68 = local_68 + 1;
            local_58 = (void *)((long)local_58 + sVar8 * sVar11);
            local_60 = (void *)((long)local_60 + sVar10 * sVar12);
          } while (local_68 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims != 1) {
          if (pMVar7[1].dims != 2) {
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar23 = 0;
          do {
            fVar28 = powf(*(float *)((long)pvVar17 + uVar23 * 4),
                          *(float *)((long)pvVar21 + uVar23 * 4));
            *(float *)((long)pvVar15 + uVar23 * 4) = fVar28;
            uVar23 = uVar23 + 1;
          } while (uVar16 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar22 = (long)(int)uVar1 * 4;
          uVar23 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
              uVar24 = 0;
              do {
                fVar29 = powf(*(float *)((long)pvVar17 + uVar24 * 4),fVar28);
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar29;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar22);
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar23 != uVar5);
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar23 = 0;
        do {
          fVar29 = powf(*(float *)((long)pvVar17 + uVar23 * 4),fVar28);
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar24 = (ulong)uVar6;
      if (pMVar7[1].dims == 3) {
        if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = pMVar7[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7->cstep;
          local_88 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar23 = 0;
              do {
                fVar28 = powf(*(float *)((long)pvVar17 + uVar23 * 4),
                              *(float *)((long)pvVar21 + sVar10 * sVar11 * local_88));
                *(float *)((long)pvVar15 + uVar23 * 4) = fVar28;
                uVar23 = uVar23 + 1;
              } while (uVar16 != uVar23);
            }
            local_88 = local_88 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (local_88 != uVar24);
          return 0;
        }
        if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                fVar28 = powf(*(float *)((long)pvVar17 + uVar18 * 4),
                              *(float *)((long)pvVar21 + uVar18 * 4));
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          local_90 = (ulong)uVar14;
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7->cstep;
          pvVar21 = pMVar7[1].data;
          sVar11 = pMVar7[1].elemsize;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7[1].cstep;
          local_88 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                fVar28 = powf(*(float *)((long)pvVar17 + sVar9 * sVar10 * local_88),
                              *(float *)((long)pvVar21 + uVar24 * 4));
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar28;
                uVar24 = uVar24 + 1;
              } while (local_90 != uVar24);
            }
            local_88 = local_88 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
          } while (local_88 != uVar23);
          return 0;
        }
        if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar7[1].cstep;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                fVar28 = powf(*(float *)((long)pvVar17 + uVar18 * 4),
                              *(float *)((long)pvVar21 + uVar18 * 4));
                *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        local_90 = (ulong)uVar14;
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              fVar28 = powf(*(float *)((long)pvVar17 + uVar18 * 4),
                            *(float *)((long)pvVar21 + uVar18 * 4));
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar28;
              uVar18 = uVar18 + 1;
            } while (local_90 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
      local_58 = this_00->data;
      if (local_58 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        local_50 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        iVar25 = pMVar7[1].w;
        sVar10 = pMVar7[1].elemsize;
        pvVar15 = pMVar7[1].data;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar1 * 4;
        sVar12 = pMVar7->cstep;
        local_68 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar23 = 0;
            pvVar17 = local_50;
            pvVar21 = local_58;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar15 + uVar23 * 4 + (long)iVar25 * sVar10 * local_68);
                uVar26 = 0;
                do {
                  fVar29 = powf(*(float *)((long)pvVar17 + uVar26 * 4),fVar28);
                  *(float *)((long)pvVar21 + uVar26 * 4) = fVar29;
                  uVar26 = uVar26 + 1;
                } while (uVar18 != uVar26);
              }
              uVar23 = uVar23 + 1;
              pvVar21 = (void *)((long)pvVar21 + lVar22);
              pvVar17 = (void *)((long)pvVar17 + lVar22);
            } while (uVar23 != uVar5);
          }
          local_68 = local_68 + 1;
          local_58 = (void *)((long)local_58 + sVar8 * sVar11);
          local_50 = (void *)((long)local_50 + sVar9 * sVar12);
        } while (local_68 != uVar24);
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar15 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar17 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
            uVar18 = 0;
            do {
              fVar29 = powf(*(float *)((long)pvVar15 + uVar18 * 4),fVar28);
              *(float *)((long)local_58 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          local_58 = (void *)((long)local_58 + sVar8 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      fVar28 = *pMVar7[1].data;
      pvVar15 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            fVar29 = powf(*(float *)((long)pvVar15 + uVar18 * 4),fVar28);
            *(float *)((long)local_58 + uVar18 * 4) = fVar29;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        local_58 = (void *)((long)local_58 + sVar8 * sVar10);
        pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (uVar1 == 1) {
      iVar25 = pMVar7[1].dims;
      if (iVar25 == 1) {
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          fVar29 = powf(fVar28,*(float *)((long)pvVar17 + uVar23 * 4));
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          fVar29 = powf(fVar28,*(float *)((long)pvVar17 + uVar23 * 4));
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
          uVar23 = uVar23 + 1;
        } while (uVar14 != uVar23);
        return 0;
      }
      if (iVar25 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        local_90 = (ulong)uVar14;
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              fVar29 = powf(fVar28,*(float *)((long)pvVar17 + uVar18 * 4));
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (local_90 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
    }
    iVar25 = pMVar7[1].dims;
    if (iVar25 != 1) {
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar2 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar2) {
            fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
            uVar18 = 0;
            do {
              fVar29 = powf(fVar28,*(float *)((long)pvVar21 + uVar18 * 4));
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar21 = (void *)((long)pvVar21 + lVar22);
        } while (uVar23 != uVar3);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        local_90 = (ulong)uVar14;
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
            uVar18 = 0;
            do {
              fVar29 = powf(fVar28,*(float *)((long)pvVar21 + uVar18 * 4));
              *(float *)((long)pvVar15 + uVar18 * 4) = fVar29;
              uVar18 = uVar18 + 1;
            } while (local_90 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      uVar23 = 0;
      do {
        fVar28 = powf(*(float *)((long)pvVar17 + uVar23 * 4),*(float *)((long)pvVar21 + uVar23 * 4))
        ;
        *(float *)((long)pvVar15 + uVar23 * 4) = fVar28;
        uVar23 = uVar23 + 1;
      } while (uVar18 != uVar23);
      return 0;
    }
    if ((int)uVar1 < 1) {
      return 0;
    }
    fVar28 = *pMVar7[1].data;
    pvVar17 = pMVar7->data;
    uVar23 = 0;
    do {
      fVar29 = powf(*(float *)((long)pvVar17 + uVar23 * 4),fVar28);
      *(float *)((long)pvVar15 + uVar23 * 4) = fVar29;
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
    return 0;
  case 7:
    uVar1 = pMVar7->w;
    uVar18 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar23 = (ulong)uVar4;
    uVar14 = uVar3 * uVar2;
    iVar25 = pMVar7->dims;
    if (iVar25 != 1) {
      uVar5 = pMVar7->h;
      uVar16 = uVar5 * uVar1;
      if (iVar25 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          iVar25 = pMVar7->w;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          lVar22 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar26 = 0;
              pvVar19 = pvVar21;
              pvVar27 = pvVar15;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar25 * sVar9 * uVar18);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar27 + uVar20 * 4) =
                         *(float *)((long)pvVar19 + uVar20 * 4) - fVar28;
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                uVar26 = uVar26 + 1;
                pvVar27 = (void *)((long)pvVar27 + lVar22);
                pvVar19 = (void *)((long)pvVar19 + lVar22);
              } while (uVar26 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
          } while (uVar18 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims != 1) {
          if (pMVar7[1].dims != 2) {
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar23 = 0;
          do {
            *(float *)((long)pvVar15 + uVar23 * 4) =
                 *(float *)((long)pvVar21 + uVar23 * 4) - *(float *)((long)pvVar17 + uVar23 * 4);
            uVar23 = uVar23 + 1;
          } while (uVar16 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar22 = (long)(int)uVar1 * 4;
          uVar23 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     fVar28 - *(float *)((long)pvVar17 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar22);
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar23 != uVar5);
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar23 * 4);
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar24 = (ulong)uVar6;
      if (pMVar7[1].dims == 3) {
        if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = pMVar7[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + sVar10 * sVar11 * uVar23) -
                     *(float *)((long)pvVar17 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) - *(float *)((long)pvVar17 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7->cstep;
          pvVar21 = pMVar7[1].data;
          sVar11 = pMVar7[1].elemsize;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) -
                     *(float *)((long)pvVar17 + sVar9 * sVar10 * uVar24);
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
          } while (uVar24 != uVar23);
          return 0;
        }
        if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar7[1].cstep;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) - *(float *)((long)pvVar17 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) - *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        iVar25 = pMVar7[1].w;
        sVar10 = pMVar7[1].elemsize;
        pvVar21 = pMVar7[1].data;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar1 * 4;
        sVar12 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar26 = 0;
            pvVar19 = pvVar17;
            pvVar27 = pvVar15;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar23);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar27 + uVar20 * 4) =
                       fVar28 - *(float *)((long)pvVar19 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              uVar26 = uVar26 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar22);
              pvVar19 = (void *)((long)pvVar19 + lVar22);
            } while (uVar26 != uVar5);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
        } while (uVar23 != uVar24);
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   fVar28 - *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      fVar28 = *pMVar7[1].data;
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (uVar1 == 1) {
      iVar25 = pMVar7[1].dims;
      if (iVar25 == 1) {
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) - fVar28;
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) - fVar28;
          uVar23 = uVar23 + 1;
        } while (uVar14 != uVar23);
        return 0;
      }
      if (iVar25 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) - fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
    }
    iVar25 = pMVar7[1].dims;
    if (iVar25 != 1) {
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar2 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar2) {
            fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) - fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar21 = (void *)((long)pvVar21 + lVar22);
        } while (uVar23 != uVar3);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) - fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar15 + uVar23 * 4) =
             *(float *)((long)pvVar21 + uVar23 * 4) - *(float *)((long)pvVar17 + uVar23 * 4);
        uVar23 = uVar23 + 1;
      } while (uVar18 != uVar23);
      return 0;
    }
    if ((int)uVar1 < 1) {
      return 0;
    }
    fVar28 = *pMVar7[1].data;
    pvVar17 = pMVar7->data;
    uVar23 = 0;
    do {
      *(float *)((long)pvVar15 + uVar23 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar23 * 4);
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
    return 0;
  case 8:
    uVar1 = pMVar7->w;
    uVar18 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar23 = (ulong)uVar4;
    uVar14 = uVar3 * uVar2;
    iVar25 = pMVar7->dims;
    if (iVar25 != 1) {
      uVar5 = pMVar7->h;
      uVar16 = uVar5 * uVar1;
      if (iVar25 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          iVar25 = pMVar7->w;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = pMVar7->elemsize;
          sVar11 = this_00->elemsize;
          lVar22 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar26 = 0;
              pvVar19 = pvVar21;
              pvVar27 = pvVar15;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar18);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar27 + uVar20 * 4) =
                         *(float *)((long)pvVar19 + uVar20 * 4) * (1.0 / fVar28);
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                uVar26 = uVar26 + 1;
                pvVar27 = (void *)((long)pvVar27 + lVar22);
                pvVar19 = (void *)((long)pvVar19 + lVar22);
              } while (uVar26 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar12);
          } while (uVar18 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims != 1) {
          if (pMVar7[1].dims != 2) {
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          uVar23 = 0;
          do {
            *(float *)((long)pvVar15 + uVar23 * 4) =
                 *(float *)((long)pvVar21 + uVar23 * 4) / *(float *)((long)pvVar17 + uVar23 * 4);
            uVar23 = uVar23 + 1;
          } while (uVar16 != uVar23);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar21 = pMVar7[1].data;
          lVar22 = (long)(int)uVar1 * 4;
          uVar23 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     fVar28 / *(float *)((long)pvVar17 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar22);
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar23 != uVar5);
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) = fVar28 / *(float *)((long)pvVar17 + uVar23 * 4);
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar24 = (ulong)uVar6;
      if (pMVar7[1].dims == 3) {
        if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = pMVar7[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + sVar10 * sVar11 * uVar23) /
                     *(float *)((long)pvVar17 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) / *(float *)((long)pvVar17 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar23 != uVar24);
          return 0;
        }
        if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7->cstep;
          pvVar21 = pMVar7[1].data;
          sVar11 = pMVar7[1].elemsize;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) /
                     *(float *)((long)pvVar17 + sVar9 * sVar10 * uVar24);
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
            pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
          } while (uVar24 != uVar23);
          return 0;
        }
        if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
          Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar21 = pMVar7[1].data;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar7[1].cstep;
          sVar13 = pMVar7->cstep;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar15 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) / *(float *)((long)pvVar17 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
          } while (uVar23 != uVar24);
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) / *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        iVar25 = pMVar7[1].w;
        sVar10 = pMVar7[1].elemsize;
        pvVar21 = pMVar7[1].data;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar1 * 4;
        sVar12 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar26 = 0;
            pvVar19 = pvVar17;
            pvVar27 = pvVar15;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar21 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar23);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar27 + uVar20 * 4) =
                       fVar28 / *(float *)((long)pvVar19 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              uVar26 = uVar26 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar22);
              pvVar19 = (void *)((long)pvVar19 + lVar22);
            } while (uVar26 != uVar5);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
        } while (uVar23 != uVar24);
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   fVar28 / *(float *)((long)pvVar17 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      fVar28 = *pMVar7[1].data;
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = fVar28 / *(float *)((long)pvVar17 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (uVar1 == 1) {
      iVar25 = pMVar7[1].dims;
      if (iVar25 == 1) {
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar17 = pMVar7[1].data;
        fVar28 = *pMVar7->data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) =
               *(float *)((long)pvVar17 + uVar23 * 4) * (1.0 / fVar28);
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar17 = pMVar7[1].data;
        fVar28 = *pMVar7->data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) =
               *(float *)((long)pvVar17 + uVar23 * 4) * (1.0 / fVar28);
          uVar23 = uVar23 + 1;
        } while (uVar14 != uVar23);
        return 0;
      }
      if (iVar25 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar7[1].elemsize;
        fVar28 = *pMVar7->data;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) * (1.0 / fVar28);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
          pvVar17 = (void *)((long)pvVar17 + sVar10 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
    }
    iVar25 = pMVar7[1].dims;
    if (iVar25 != 1) {
      if (iVar25 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar2 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar2) {
            fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) * (1.0 / fVar28);
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar21 = (void *)((long)pvVar21 + lVar22);
        } while (uVar23 != uVar3);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar21 + uVar18 * 4) * (1.0 / fVar28);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
        } while (uVar24 != uVar23);
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar15 + uVar23 * 4) =
             *(float *)((long)pvVar21 + uVar23 * 4) / *(float *)((long)pvVar17 + uVar23 * 4);
        uVar23 = uVar23 + 1;
      } while (uVar18 != uVar23);
      return 0;
    }
    if ((int)uVar1 < 1) {
      return 0;
    }
    fVar28 = *pMVar7[1].data;
    pvVar17 = pMVar7->data;
    uVar23 = 0;
    do {
      *(float *)((long)pvVar15 + uVar23 * 4) = fVar28 / *(float *)((long)pvVar17 + uVar23 * 4);
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
    return 0;
  }
  uVar1 = pMVar7->w;
  uVar18 = (ulong)uVar1;
  sVar8 = pMVar7->elemsize;
  uVar2 = pMVar7[1].w;
  uVar24 = (ulong)uVar2;
  uVar3 = pMVar7[1].h;
  uVar4 = pMVar7[1].c;
  uVar23 = (ulong)uVar4;
  uVar14 = uVar3 * uVar2;
  iVar25 = pMVar7->dims;
  if (iVar25 != 1) {
    uVar5 = pMVar7->h;
    uVar16 = uVar5 * uVar1;
    if (iVar25 == 2) {
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        iVar25 = pMVar7->w;
        sVar9 = pMVar7->elemsize;
        sVar10 = pMVar7[1].elemsize;
        sVar11 = this_00->elemsize;
        lVar22 = (long)(int)uVar2 * 4;
        sVar12 = pMVar7[1].cstep;
        uVar18 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar26 = 0;
            pvVar19 = pvVar21;
            pvVar27 = pvVar15;
            do {
              if (0 < (int)uVar2) {
                fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar25 * sVar9 * uVar18);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar27 + uVar20 * 4) =
                       fVar28 - *(float *)((long)pvVar19 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar24 != uVar20);
              }
              uVar26 = uVar26 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar22);
              pvVar19 = (void *)((long)pvVar19 + lVar22);
            } while (uVar26 != uVar3);
          }
          uVar18 = uVar18 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
        } while (uVar18 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if ((int)uVar16 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        uVar23 = 0;
        do {
          *(float *)((long)pvVar15 + uVar23 * 4) =
               *(float *)((long)pvVar17 + uVar23 * 4) - *(float *)((long)pvVar21 + uVar23 * 4);
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar5,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        pvVar21 = pMVar7[1].data;
        lVar22 = (long)(int)uVar1 * 4;
        uVar23 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
            uVar24 = 0;
            do {
              *(float *)((long)pvVar15 + uVar24 * 4) =
                   *(float *)((long)pvVar17 + uVar24 * 4) - fVar28;
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar22);
          pvVar17 = (void *)((long)pvVar17 + lVar22);
        } while (uVar23 != uVar5);
        return 0;
      }
      if ((int)uVar16 < 1) {
        return 0;
      }
      fVar28 = *pMVar7[1].data;
      pvVar17 = pMVar7->data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) - fVar28;
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar6 = pMVar7->c;
    uVar24 = (ulong)uVar6;
    if (pMVar7[1].dims == 3) {
      if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
        Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = pMVar7[1].elemsize;
        sVar11 = pMVar7[1].cstep;
        sVar12 = this_00->elemsize;
        sVar13 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) -
                   *(float *)((long)pvVar21 + sVar10 * sVar11 * uVar23);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((uVar2 == uVar1) && (uVar4 == 1 && uVar3 == uVar5)) {
        Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) - *(float *)((long)pvVar21 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar23 != uVar24);
        return 0;
      }
      if ((uVar1 == 1) && ((uVar5 == 1 && (uVar4 == uVar6)))) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        sVar10 = pMVar7->cstep;
        pvVar21 = pMVar7[1].data;
        sVar11 = pMVar7[1].elemsize;
        sVar12 = this_00->elemsize;
        sVar13 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + sVar9 * sVar10 * uVar24) -
                   *(float *)((long)pvVar21 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          pvVar21 = (void *)((long)pvVar21 + sVar11 * sVar13);
        } while (uVar24 != uVar23);
        return 0;
      }
      if ((uVar2 != uVar1) || (uVar6 != 1 || uVar5 != uVar3)) {
        Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        pvVar21 = pMVar7[1].data;
        sVar10 = pMVar7[1].elemsize;
        sVar11 = this_00->elemsize;
        sVar12 = pMVar7[1].cstep;
        sVar13 = pMVar7->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar15 + uVar18 * 4) =
                   *(float *)((long)pvVar17 + uVar18 * 4) - *(float *)((long)pvVar21 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          uVar23 = uVar23 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar21 = (void *)((long)pvVar21 + sVar10 * sVar12);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
        } while (uVar23 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      sVar9 = pMVar7[1].elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7[1].cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) =
                 *(float *)((long)pvVar17 + uVar18 * 4) - *(float *)((long)pvVar21 + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        uVar24 = uVar24 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
      } while (uVar24 != uVar23);
      return 0;
    }
    Mat::create(this_00,uVar1,uVar5,uVar6,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    sVar8 = this_00->cstep;
    if ((long)this_00->c * sVar8 == 0) {
      return -100;
    }
    if (pMVar7[1].dims != 1) {
      if (pMVar7[1].dims != 2) {
        return 0;
      }
      if ((int)uVar6 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      iVar25 = pMVar7[1].w;
      sVar10 = pMVar7[1].elemsize;
      pvVar21 = pMVar7[1].data;
      sVar11 = this_00->elemsize;
      lVar22 = (long)(int)uVar1 * 4;
      sVar12 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar26 = 0;
          pvVar19 = pvVar17;
          pvVar27 = pvVar15;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar21 + uVar26 * 4 + (long)iVar25 * sVar10 * uVar23);
              uVar20 = 0;
              do {
                *(float *)((long)pvVar27 + uVar20 * 4) =
                     *(float *)((long)pvVar19 + uVar20 * 4) - fVar28;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
            }
            uVar26 = uVar26 + 1;
            pvVar27 = (void *)((long)pvVar27 + lVar22);
            pvVar19 = (void *)((long)pvVar19 + lVar22);
          } while (uVar26 != uVar5);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
      } while (uVar23 != uVar24);
      return 0;
    }
    if (pMVar7[1].w != 1) {
      if ((int)uVar6 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      sVar9 = pMVar7->elemsize;
      pvVar21 = pMVar7[1].data;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7->cstep;
      uVar23 = 0;
      do {
        if (0 < (int)uVar16) {
          fVar28 = *(float *)((long)pvVar21 + uVar23 * 4);
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = *(float *)((long)pvVar17 + uVar18 * 4) - fVar28
            ;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar23 != uVar24);
      return 0;
    }
    if ((int)uVar6 < 1) {
      return 0;
    }
    fVar28 = *pMVar7[1].data;
    pvVar17 = pMVar7->data;
    sVar9 = pMVar7->elemsize;
    sVar10 = this_00->elemsize;
    sVar11 = pMVar7->cstep;
    uVar23 = 0;
    do {
      if (0 < (int)uVar16) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar15 + uVar18 * 4) = *(float *)((long)pvVar17 + uVar18 * 4) - fVar28;
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
      }
      uVar23 = uVar23 + 1;
      pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
    } while (uVar23 != uVar24);
    return 0;
  }
  if (uVar1 == 1) {
    iVar25 = pMVar7[1].dims;
    if (iVar25 == 1) {
      Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if ((int)uVar2 < 1) {
        return 0;
      }
      fVar28 = *pMVar7->data;
      pvVar17 = pMVar7[1].data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar15 + uVar23 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar23 * 4);
        uVar23 = uVar23 + 1;
      } while (uVar24 != uVar23);
      return 0;
    }
    if (iVar25 == 2) {
      Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar28 = *pMVar7->data;
      pvVar17 = pMVar7[1].data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar15 + uVar23 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar23 * 4);
        uVar23 = uVar23 + 1;
      } while (uVar14 != uVar23);
      return 0;
    }
    if (iVar25 == 3) {
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      fVar28 = *pMVar7->data;
      pvVar17 = pMVar7[1].data;
      sVar9 = pMVar7[1].elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7[1].cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        uVar24 = uVar24 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar24 != uVar23);
      return 0;
    }
  }
  iVar25 = pMVar7[1].dims;
  if (iVar25 != 1) {
    if (iVar25 == 2) {
      Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      pvVar17 = pMVar7->data;
      pvVar21 = pMVar7[1].data;
      lVar22 = (long)(int)uVar2 * 4;
      uVar23 = 0;
      do {
        if (0 < (int)uVar2) {
          fVar28 = *(float *)((long)pvVar17 + uVar23 * 4);
          uVar18 = 0;
          do {
            *(float *)((long)pvVar15 + uVar18 * 4) = fVar28 - *(float *)((long)pvVar21 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar24 != uVar18);
        }
        uVar23 = uVar23 + 1;
        pvVar15 = (void *)((long)pvVar15 + lVar22);
        pvVar21 = (void *)((long)pvVar21 + lVar22);
      } while (uVar23 != uVar3);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    sVar8 = this_00->cstep;
    if ((long)this_00->c * sVar8 == 0) {
      return -100;
    }
    if ((int)uVar4 < 1) {
      return 0;
    }
    pvVar17 = pMVar7->data;
    pvVar21 = pMVar7[1].data;
    sVar9 = pMVar7[1].elemsize;
    sVar10 = this_00->elemsize;
    sVar11 = pMVar7[1].cstep;
    uVar24 = 0;
    do {
      if (0 < (int)uVar14) {
        fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
        uVar18 = 0;
        do {
          *(float *)((long)pvVar15 + uVar18 * 4) = fVar28 - *(float *)((long)pvVar21 + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar14 != uVar18);
      }
      uVar24 = uVar24 + 1;
      pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
    } while (uVar24 != uVar23);
    return 0;
  }
  Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
  pvVar15 = this_00->data;
  if (pvVar15 == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (pMVar7[1].w != 1) {
    if ((int)uVar1 < 1) {
      return 0;
    }
    pvVar17 = pMVar7->data;
    pvVar21 = pMVar7[1].data;
    uVar23 = 0;
    do {
      *(float *)((long)pvVar15 + uVar23 * 4) =
           *(float *)((long)pvVar17 + uVar23 * 4) - *(float *)((long)pvVar21 + uVar23 * 4);
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
    return 0;
  }
  if ((int)uVar1 < 1) {
    return 0;
  }
  fVar28 = *pMVar7[1].data;
  pvVar17 = pMVar7->data;
  uVar23 = 0;
  do {
    *(float *)((long)pvVar15 + uVar23 * 4) = *(float *)((long)pvVar17 + uVar23 * 4) - fVar28;
    uVar23 = uVar23 + 1;
  } while (uVar18 != uVar23);
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op< std::plus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op< std::minus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op< std::multiplies<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op< std::divides<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op< binary_op_max<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op< binary_op_min<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op< binary_op_pow<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op< binary_op_rsub<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op< binary_op_rdiv<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}